

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

int __thiscall
c4::basic_substring<const_char>::compare(basic_substring<const_char> *this,char *that,size_t sz)

{
  ulong uVar1;
  char *pcVar2;
  code *pcVar3;
  error_flags eVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  char cVar9;
  char cVar10;
  bool bVar11;
  
  if (sz != 0 && that == (char *)0x0) {
    eVar4 = get_error_flags();
    if ((eVar4 & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar3 = (code *)swi(3);
        iVar5 = (*pcVar3)();
        return iVar5;
      }
    }
    handle_error(0x1fbf87,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14de,"that || sz == 0");
  }
  if ((this->str == (char *)0x0) && (this->len != 0)) {
    eVar4 = get_error_flags();
    if ((eVar4 & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar3 = (code *)swi(3);
        iVar5 = (*pcVar3)();
        return iVar5;
      }
    }
    handle_error(0x1fbf87,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14df,"str || len == 0");
  }
  uVar1 = this->len;
  if ((that == (char *)0x0) || (pcVar2 = this->str, pcVar2 == (char *)0x0)) {
    uVar7 = 0;
    if (uVar1 == sz) {
      if (sz != 0) {
        eVar4 = get_error_flags();
        if ((eVar4 & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar3 = (code *)swi(3);
            iVar5 = (*pcVar3)();
            return iVar5;
          }
        }
        handle_error(0x1fbf87,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14f1,"len == 0 && sz == 0");
      }
    }
    else {
      uVar7 = -(uint)(uVar1 < sz) | 1;
    }
  }
  else {
    sVar8 = sz;
    if (uVar1 < sz) {
      sVar8 = uVar1;
    }
    uVar7 = 0xffffffff;
    bVar11 = sVar8 != 0;
    if (bVar11) {
      cVar9 = *pcVar2;
      cVar10 = *that;
      if (cVar9 == cVar10) {
        uVar6 = 0;
        do {
          if (sVar8 - 1 == uVar6) {
            bVar11 = false;
            goto LAB_0018fdd2;
          }
          cVar9 = pcVar2[uVar6 + 1];
          cVar10 = that[uVar6 + 1];
          uVar6 = uVar6 + 1;
        } while (cVar9 == cVar10);
        bVar11 = uVar6 < sVar8;
      }
      uVar7 = (uint)(cVar10 <= cVar9) * 2 - 1;
    }
LAB_0018fdd2:
    if (sz <= uVar1 && !bVar11) {
      uVar7 = (uint)(uVar1 != sz);
    }
  }
  return uVar7;
}

Assistant:

C4_PURE int compare(const char *C4_RESTRICT that, size_t sz) const noexcept
    {
        C4_XASSERT(that || sz  == 0);
        C4_XASSERT(str  || len == 0);
        if(C4_LIKELY(str && that))
        {
            {
                const size_t min = len < sz ? len : sz;
                for(size_t i = 0; i < min; ++i)
                    if(str[i] != that[i])
                        return str[i] < that[i] ? -1 : 1;
            }
            if(len < sz)
                return -1;
            else if(len == sz)
                return 0;
            else
                return 1;
        }
        else if(len == sz)
        {
            C4_XASSERT(len == 0 && sz == 0);
            return 0;
        }
        return len < sz ? -1 : 1;
    }